

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Value(RecyclableObjectDisplay *this,int radix)

{
  Var pvVar1;
  JavascriptLibrary *pJVar2;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  JavascriptNumberObject *this_01;
  StaticType *type;
  JavascriptString *pJVar11;
  JavascriptString *pstRight;
  undefined4 extraout_var;
  char16 *pcVar12;
  Type TVar13;
  ulong uVar14;
  double value;
  undefined1 auVar15 [16];
  
  uVar14 = (ulong)this->instance & 0xffff000000000000;
  if (((ulong)this->instance & 0x1ffff00000000) != 0x1000000000000 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008c2894;
    *puVar7 = 0;
  }
  if (((uVar14 != 0x1000000000000) && ((ulong)this->instance >> 0x32 == 0)) &&
     (bVar4 = VarIs<Js::JavascriptNumberObject>(this->instance), !bVar4)) {
    pvVar1 = this->instance;
    if (pvVar1 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    TVar13 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar13 = TypeIds_Number, pvVar1 < (Var)0x4000000000000)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
      TVar13 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar13) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
    }
    if (TVar13 != TypeIds_Int64Number) {
      pvVar1 = this->instance;
      if (pvVar1 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
      if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
      TVar13 = TypeIds_FirstNumberType;
      if ((((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) &&
         (TVar13 = TypeIds_Number, pvVar1 < (Var)0x4000000000000)) {
        pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
        if (pRVar8 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008c2894;
          *puVar7 = 0;
        }
        TVar13 = ((pRVar8->type).ptr)->typeId;
        if ((0x57 < (int)TVar13) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_008c2894;
          *puVar7 = 0;
        }
      }
      if (TVar13 != TypeIds_LastNumberType) {
        pRVar8 = VarTo<Js::RecyclableObject>(this->instance);
        this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
                  stringBuilder;
        this_00->length = 0;
        this_00->count = 0;
        this_00->lastChunk = (Data *)0x0;
        this_00->firstChunk = (Data *)0x0;
        this_00->secondChunk = (Data *)0x0;
        iVar6 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x50])(pRVar8,this_00,this->scriptContext);
        if (iVar6 == 0) {
          return L"undefined";
        }
        pcVar12 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
        return pcVar12;
      }
    }
  }
  uVar14 = (ulong)this->instance & 0xffff000000000000;
  if (((ulong)this->instance & 0x1ffff00000000) != 0x1000000000000 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008c2894;
    *puVar7 = 0;
  }
  pvVar1 = this->instance;
  if (uVar14 == 0x1000000000000) {
    value = (double)(int)pvVar1;
  }
  else {
    if ((ulong)pvVar1 >> 0x32 != 0) {
      value = (double)((ulong)pvVar1 ^ 0xfffc000000000000);
      goto LAB_008c26fd;
    }
    if (pvVar1 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    TVar13 = TypeIds_FirstNumberType;
    if (((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
      TVar13 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar13) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
    }
    pvVar1 = this->instance;
    if (TVar13 == TypeIds_Int64Number) {
      pJVar9 = VarTo<Js::JavascriptTypedNumber<long>>(pvVar1);
      value = (double)pJVar9->m_value;
      goto LAB_008c26fd;
    }
    if (pvVar1 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_008c2894;
      *puVar7 = 0;
    }
    TVar13 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar13 = TypeIds_Number, pvVar1 < (Var)0x4000000000000)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c2894;
        *puVar7 = 0;
      }
      TVar13 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar13) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_008c2894:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
    if (TVar13 == TypeIds_LastNumberType) {
      pJVar10 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(this->instance);
      auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar10->m_value);
      auVar15._8_4_ = (int)(pJVar10->m_value >> 0x20);
      auVar15._12_4_ = 0x45300000;
      value = (auVar15._0_8_ - 4503599627370496.0) + (auVar15._8_8_ - 1.9342813113834067e+25);
    }
    else {
      this_01 = VarTo<Js::JavascriptNumberObject>(this->instance);
      value = JavascriptNumberObject::GetValue(this_01);
    }
  }
LAB_008c26fd:
  if (((radix == 10) || (value != (double)(int)value)) || (NAN(value) || NAN((double)(int)value))) {
    bVar4 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    if (bVar4) {
      return L"-0";
    }
    pJVar11 = JavascriptNumber::ToStringRadix10(value,this->scriptContext);
  }
  else {
    if (0x22 < radix - 2U) {
      return L"";
    }
    if (radix == 0x10) {
      pJVar2 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
      type = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
      pJVar11 = &LiteralString::New(type,L"0x",2,pJVar2->recycler)->super_JavascriptString;
      pstRight = JavascriptNumber::ToStringRadixHelper
                           ((double)(-(ulong)(value < 0.0) & (ulong)(double)(uint)(int)value |
                                    ~-(ulong)(value < 0.0) & (ulong)value),0x10,this->scriptContext)
      ;
      pJVar11 = JavascriptString::Concat(pJVar11,pstRight);
    }
    else {
      pJVar11 = JavascriptNumber::ToStringRadixHelper(value,radix,this->scriptContext);
    }
  }
  iVar6 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar11);
  return (LPCWSTR)CONCAT44(extraout_var,iVar6);
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Value(int radix)
    {
        LPCWSTR valueStr = _u("");

        if(Js::TaggedInt::Is(instance)
            || Js::JavascriptNumber::Is(instance)
            || Js::VarIs<Js::JavascriptNumberObject>(instance)
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
        {
            double value;
            if (Js::TaggedInt::Is(instance))
            {
                value = TaggedInt::ToDouble(instance);
            }
            else if (Js::JavascriptNumber::Is(instance))
            {
                value = Js::JavascriptNumber::GetValue(instance);
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number)
            {
                value = (double)VarTo<JavascriptInt64Number>(instance)->GetValue();
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
            {
                value = (double)VarTo<JavascriptUInt64Number>(instance)->GetValue();
            }
            else
            {
                Js::JavascriptNumberObject* numobj = Js::VarTo<Js::JavascriptNumberObject>(instance);
                value = numobj->GetValue();
            }

            // For fractional values, radix is ignored.
            int32 l = (int32)value;
            bool isZero = JavascriptNumber::IsZero(value - (double)l);

            if (radix == 10 || !isZero)
            {
                if (Js::JavascriptNumber::IsNegZero(value))
                {
                    // In debugger, we wanted to show negative zero explicitly
                    valueStr = _u("-0");
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadix10(value, scriptContext)->GetSz();
                }
            }
            else if (radix >= 2 && radix <= 36)
            {
                if (radix == 16)
                {
                    if (value < 0)
                    {
                        // On the tools side we show unsigned value.
                        uint32 ul = static_cast<uint32>(static_cast<int32>(value)); // ARM: casting negative value to uint32 gives 0
                        value = (double)ul;
                    }
                    valueStr = Js::JavascriptString::Concat(scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("0x")),
                                                            Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext))->GetSz();
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext)->GetSz();
                }
            }
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            if (obj->GetDiagValueString(builder, scriptContext))
            {
                valueStr = builder->Detach();
            }
            else
            {
                valueStr = _u("undefined");
            }
        }

        return valueStr;
    }